

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallDirectoryGenerator::AddDirectoryInstallRule
          (cmInstallDirectoryGenerator *this,ostream *os,string *config,Indent *indent,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs)

{
  bool bVar1;
  char *rename;
  char *files;
  char *permissions_file;
  char *permissions_dir;
  char *literal_args;
  string local_68;
  char *local_48;
  char *no_rename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirs_local;
  Indent *indent_local;
  string *config_local;
  ostream *os_local;
  cmInstallDirectoryGenerator *this_local;
  
  local_48 = (char *)0x0;
  no_rename = (char *)dirs;
  dirs_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)indent;
  indent_local = (Indent *)config;
  config_local = (string *)os;
  os_local = (ostream *)this;
  GetDestination(&local_68,this,config);
  files = no_rename;
  bVar1 = this->Optional;
  permissions_file = (char *)std::__cxx11::string::c_str();
  permissions_dir = (char *)std::__cxx11::string::c_str();
  rename = local_48;
  literal_args = (char *)std::__cxx11::string::c_str();
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,&local_68,cmInstallType_DIRECTORY,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)files,(bool)(bVar1 & 1),permissions_file,permissions_dir,rename,literal_args,
             (Indent *)dirs_local);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void cmInstallDirectoryGenerator::AddDirectoryInstallRule(
  std::ostream& os,
  const std::string& config,
  Indent const& indent,
  std::vector<std::string> const& dirs)
{
  // Write code to install the directories.
  const char* no_rename = 0;
  this->AddInstallRule(os,
                       this->GetDestination(config),
                       cmInstallType_DIRECTORY,
                       dirs,
                       this->Optional,
                       this->FilePermissions.c_str(),
                       this->DirPermissions.c_str(),
                       no_rename, this->LiteralArguments.c_str(),
                       indent);
}